

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GetCodeCmdMovHelper(CodeGenRegVmContext *ctx,uchar lhs,uchar rhs,RegVmCopyType copyType)

{
  x86Reg reg1;
  x86XmmReg reg1_00;
  x86Size size;
  undefined7 in_register_00000011;
  x86Command op;
  uint shift;
  
  shift = (int)CONCAT71(in_register_00000011,rhs) << 3;
  if (copyType == rvcDouble) {
    reg1_00 = CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,shift,true);
    if (reg1_00 == rXmmRegCount) {
      reg1_00 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg1_00,sQWORD,rEBX,shift);
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    }
    else {
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    }
    EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)lhs << 3,reg1_00);
    return;
  }
  if (copyType == rvcInt) {
    reg1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,shift,true);
    if (reg1 != rRegCount) {
LAB_001ccb0c:
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      op = o_mov;
      size = sDWORD;
      goto LAB_001ccba1;
    }
    reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
    op = o_mov;
    size = sDWORD;
  }
  else {
    reg1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,shift,true);
    if (reg1 != rRegCount) {
      CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
                (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
      op = o_mov64;
      size = sQWORD;
      goto LAB_001ccba1;
    }
    reg1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,shift,true);
    if (reg1 != rRegCount) goto LAB_001ccb0c;
    reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
    op = o_mov64;
    size = sQWORD;
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,op,reg1,size,rEBX,shift);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
LAB_001ccba1:
  EMIT_OP_RPTR_REG(&ctx->ctx,op,size,rEBX,(uint)lhs << 3,reg1);
  return;
}

Assistant:

void GetCodeCmdMovHelper(CodeGenRegVmContext &ctx, unsigned char lhs, unsigned char rhs, RegVmCopyType copyType)
{
	if(copyType == rvcInt)
	{
		x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, rhs * 8, true);

		if(sourceReg != rRegCount)
		{
			ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, sourceReg); // Store to target
			return;
		}

		sourceReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, sourceReg, sDWORD, rREG, rhs * 8); // Load source

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

	if(copyType == rvcDouble)
	{
		x86XmmReg sourceReg = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, rhs * 8, true);

		if(sourceReg != rXmmRegCount)
		{
			ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

			EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
			return;
		}

		sourceReg = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, sourceReg, sQWORD, rREG, rhs * 8); // Load source

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

#if defined(_M_X64)
	x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sQWORD, rNONE, 1, rREG, rhs * 8, true);

	if(sourceReg != rRegCount)
	{
		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

	// Maybe last write was of dword size
	sourceReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, rhs * 8, true);

	if(sourceReg != rRegCount)
	{
		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, sourceReg); // Store to target
		return;
	}

	sourceReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, sourceReg, sQWORD, rREG, rhs * 8); // Load source

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, lhs * 8, sourceReg); // Store to target
#else
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, rhs * 8); // Load source
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8, rEAX); // Store to target

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, rhs * 8 + 4); // Load source
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, lhs * 8 + 4, rEAX); // Store to target
#endif
}